

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

Bool prvTidynodeHasText(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  ulong uVar3;
  
  if ((node != (Node *)0x0 && doc != (TidyDocImpl *)0x0) &&
     (uVar3 = (ulong)node->start, node->start < node->end)) {
    pLVar1 = doc->lexer;
    do {
      BVar2 = prvTidyIsWhite((int)pLVar1->lexbuf[uVar3]);
      if (BVar2 == no) {
        return yes;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < node->end);
  }
  return no;
}

Assistant:

Bool TY_(nodeHasText)( TidyDocImpl* doc, Node* node )
{
  if ( doc && node )
  {
    uint ix;
    Lexer* lexer = doc->lexer;
    for ( ix = node->start; ix < node->end; ++ix )
    {
        /* whitespace */
        if ( !TY_(IsWhite)( lexer->lexbuf[ix] ) )
            return yes;
    }
  }
  return no;
}